

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O2

void update_sample(qsound_chip *chip)

{
  char cVar1;
  INT16 IVar2;
  UINT16 UVar3;
  ushort uVar4;
  short sVar5;
  short sVar6;
  UINT16 UVar7;
  int iVar8;
  INT32 IVar9;
  INT32 IVar10;
  INT16 *pIVar11;
  short sVar12;
  UINT16 UVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  INT16 IVar20;
  INT16 *in_RSI;
  INT16 IVar21;
  int iVar22;
  int iVar23;
  INT16 IVar24;
  long lVar25;
  long lVar26;
  
  UVar3 = chip->state;
  if (UVar3 == 0x39) {
    for (lVar26 = 0; lVar26 != 0x310; lVar26 = lVar26 + 0x188) {
      *(undefined8 *)((long)chip->filter[0].taps + lVar26 + -10) = 0x5f;
      pIVar11 = get_filter_table((qsound_chip *)
                                 (ulong)*(ushort *)((long)chip->filter[0].taps + lVar26 + -2),
                                 (UINT16)in_RSI);
      if (pIVar11 != (INT16 *)0x0) {
        memcpy((void *)((long)chip->filter[0].taps + lVar26),pIVar11,0xbe);
        in_RSI = pIVar11;
      }
    }
    chip->state = 0x314;
    chip->next_state = 0x314;
  }
  else if (UVar3 == 0x4f) {
    for (lVar26 = -0x310; lVar26 != 0; lVar26 = lVar26 + 0x188) {
      *(undefined8 *)((long)chip->alt_filter[0].taps + lVar26 + -10) = 0x2d;
      pIVar11 = get_filter_table((qsound_chip *)
                                 (ulong)*(ushort *)((long)chip->alt_filter[0].taps + lVar26 + -2),
                                 (UINT16)in_RSI);
      if (pIVar11 != (INT16 *)0x0) {
        memcpy((void *)((long)chip->alt_filter[0].taps + lVar26),pIVar11,0x5a);
        in_RSI = pIVar11;
      }
      *(undefined8 *)((long)chip->wet[0].delay_line + lVar26 + -8) = 0x2c;
      pIVar11 = get_filter_table((qsound_chip *)
                                 (ulong)*(ushort *)((long)chip->wet[0].delay_line + lVar26),
                                 (UINT16)in_RSI);
      if (pIVar11 != (INT16 *)0x0) {
        memcpy((void *)((long)chip->wet[0].delay_line + lVar26 + 2),pIVar11,0x58);
        in_RSI = pIVar11;
      }
    }
    chip->state = 0x6b2;
    chip->next_state = 0x6b2;
  }
  else {
    if ((UVar3 == 0x314) || (UVar3 == 0x6b2)) {
      chip->ready_flag = 0x80;
      sVar12 = -0x554;
      if (UVar3 == 0x6b2) {
        sVar12 = -0x53c;
      }
      sVar12 = sVar12 + (chip->echo).end_pos;
      lVar26 = 0;
      sVar5 = 0;
      if (0 < sVar12) {
        sVar5 = sVar12;
      }
      sVar12 = 0x400;
      if (sVar5 < 0x400) {
        sVar12 = sVar5;
      }
      (chip->echo).length = sVar12;
      uVar16 = chip->muteMask;
      lVar25 = 0x488;
      iVar23 = 0;
      for (; lVar26 != 0x10; lVar26 = lVar26 + 1) {
        if ((uVar16 >> ((uint)lVar26 & 0x1f) & 1) == 0) {
          sVar12 = *(short *)((long)chip + lVar25 * 8 + -0x2102);
          UVar3 = *(UINT16 *)((long)chip + lVar25 * 8 + -0x210c);
          IVar2 = get_sample(chip,*(UINT16 *)((long)chip + lVar25 * 8 + -0x210e),UVar3);
          uVar14 = (uint)(*(ushort *)((long)chip + lVar25 * 8 + -0x210a) >> 4) +
                   (short)UVar3 * 0x1000 + (uint)*(ushort *)((long)chip + lVar25 * 8 + -0x2108);
          if ((int)*(short *)((long)chip + lVar25 * 8 + -0x2104) <= (int)uVar14 >> 0xc) {
            uVar14 = uVar14 + *(short *)((long)chip + lVar25 * 8 + -0x2106) * -0x1000;
          }
          sVar12 = (short)((uint)((int)IVar2 * (int)sVar12) >> 0xe);
          iVar23 = iVar23 + (int)*(short *)((long)chip + lVar25 * 8 + -0x2100) * (int)sVar12 * 4;
          if ((int)uVar14 < -0x7ffffff) {
            uVar14 = 0xf8000000;
          }
          if (0x7fffffe < (int)uVar14) {
            uVar14 = 0x7ffffff;
          }
          *(short *)((long)chip + lVar25 * 8 + -0x210c) = (short)(uVar14 >> 0xc);
          *(short *)((long)chip + lVar25 * 8 + -0x210a) = (short)(uVar14 << 4);
        }
        else {
          sVar12 = 0;
        }
        *(short *)((long)chip->out + lVar25 + -0x1e) = sVar12;
        lVar25 = lVar25 + 2;
      }
      iVar18 = chip->state_counter % 3;
      uVar14 = iVar18 + 0x10;
      if ((uVar16 >> (uVar14 & 0x1f) & 1) == 0) {
        if (chip->state_counter + 2U < 5) {
          UVar3 = chip->adpcm[iVar18].cur_addr;
          if (UVar3 == chip->adpcm[iVar18].end_addr) {
            chip->adpcm[iVar18].cur_vol = 0;
          }
          if (chip->adpcm[iVar18].flag != 0) {
            chip->voice_output[uVar14] = 0;
            chip->adpcm[iVar18].flag = 0;
            chip->adpcm[iVar18].step_size = 10;
            UVar3 = chip->adpcm[iVar18].start_addr;
            chip->adpcm[iVar18].cur_vol = chip->adpcm[iVar18].volume;
            chip->adpcm[iVar18].cur_addr = UVar3;
          }
          IVar2 = get_sample(chip,chip->adpcm[iVar18].bank,UVar3);
          cVar1 = (char)((ushort)IVar2 >> 8);
        }
        else {
          UVar3 = chip->adpcm[iVar18].bank;
          UVar7 = chip->adpcm[iVar18].cur_addr;
          chip->adpcm[iVar18].cur_addr = UVar7 + 1;
          uVar4 = get_sample(chip,UVar3,UVar7);
          cVar1 = (char)(uVar4 >> 4);
        }
        iVar8 = (int)cVar1 >> 4;
        uVar16 = iVar8 * -2;
        if (iVar8 * -2 < 0) {
          uVar16 = iVar8 * 2;
        }
        iVar15 = (int)chip->adpcm[iVar18].step_size;
        iVar17 = (int)((uVar16 | 1) * iVar15) >> 1;
        iVar22 = -iVar17;
        if (0 < iVar8) {
          iVar22 = iVar17;
        }
        iVar22 = chip->voice_output[uVar14] + iVar22;
        iVar17 = -0x8000;
        if (-0x8000 < iVar22) {
          iVar17 = iVar22;
        }
        if (0x7ffe < iVar17) {
          iVar17 = 0x7fff;
        }
        chip->voice_output[uVar14] = (INT16)((uint)(chip->adpcm[iVar18].cur_vol * iVar17) >> 0x10);
        sVar5 = (short)((uint)(adpcm_step_table[iVar8 + 8] * iVar15) >> 6);
        sVar12 = 1;
        if (0 < sVar5) {
          sVar12 = sVar5;
        }
        sVar6 = 2000;
        if (sVar5 < 0x7d1) {
          sVar6 = sVar12;
        }
        chip->adpcm[iVar18].step_size = sVar6;
      }
      else {
        chip->voice_output[uVar14] = 0;
      }
      sVar12 = (chip->echo).delay_pos;
      sVar5 = (chip->echo).delay_line[sVar12];
      sVar6 = (chip->echo).last_sample;
      (chip->echo).last_sample = sVar5;
      iVar18 = (int)sVar6 + (int)sVar5 >> 1;
      (chip->echo).delay_pos = sVar12 + 1;
      (chip->echo).delay_line[sVar12] =
           (INT16)((uint)(iVar23 + (chip->echo).feedback * iVar18 * 4) >> 0x10);
      if ((chip->echo).length <= (chip->echo).delay_pos) {
        (chip->echo).delay_pos = 0;
      }
      uVar16 = iVar18 << 0xe;
      for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
        uVar14 = 0;
        if (lVar26 == 1) {
          uVar14 = uVar16;
        }
        uVar19 = 0;
        if (lVar26 == 0) {
          uVar19 = uVar16;
        }
        for (lVar25 = -0x13; lVar25 != 0; lVar25 = lVar25 + 1) {
          uVar4 = chip->voice_output[lVar25] - 0x110;
          if (0x60 < uVar4) {
            uVar4 = 0x61;
          }
          iVar23 = (int)(chip->echo).delay_line[lVar25 + -4];
          uVar19 = uVar19 - chip->pan_tables[lVar26][0][uVar4] * iVar23;
          uVar14 = uVar14 - chip->pan_tables[lVar26][1][uVar4] * iVar23;
        }
        if ((int)uVar19 < -0x1ffffffe) {
          uVar19 = 0xe0000001;
        }
        if (0x1ffffffe < (int)uVar19) {
          uVar19 = 0x1fffffff;
        }
        if ((int)uVar14 < -0x1ffffffe) {
          uVar14 = 0xe0000001;
        }
        if (0x1ffffffe < (int)uVar14) {
          uVar14 = 0x1fffffff;
        }
        IVar9 = fir(chip->filter + lVar26,(INT16)((int)uVar14 >> 0xe));
        if (chip->state == 0x6b2) {
          IVar10 = fir(chip->alt_filter + lVar26,(INT16)(uVar19 >> 0xe));
        }
        else {
          IVar10 = uVar19 << 2;
        }
        IVar9 = delay(chip->wet + lVar26,IVar9);
        IVar10 = delay(chip->dry + lVar26,IVar10);
        iVar23 = IVar10 + IVar9 + 0x2000 >> 0xe;
        if (iVar23 < -0x7ffe) {
          iVar23 = -0x7fff;
        }
        IVar2 = (INT16)iVar23;
        if (0x7ffe < iVar23) {
          IVar2 = 0x7fff;
        }
        chip->out[lVar26] = IVar2;
        if (chip->delay_update != 0) {
          delay_update(chip->wet + lVar26);
          delay_update(chip->dry + lVar26);
        }
      }
      chip->delay_update = 0;
      iVar23 = chip->state_counter;
      chip->state_counter = iVar23 + 1;
      if (iVar23 < 5) {
        return;
      }
    }
    else if (chip->state_counter < 2) {
      if (chip->state_counter == 1) {
        chip->state_counter = 2;
        return;
      }
      memset(chip->voice,0,0x130);
      memset(&(chip->echo).feedback,0,0xfe0);
      for (lVar26 = -0x13; lVar26 != 0; lVar26 = lVar26 + 1) {
        chip->voice_output[lVar26] = 0x120;
        (chip->echo).delay_line[lVar26 + -4] = 0;
      }
      for (lVar26 = 0; lVar26 != 0x100; lVar26 = lVar26 + 0x10) {
        *(undefined2 *)((long)&chip->voice[0].bank + lVar26) = 0x8000;
      }
      for (lVar26 = 0; lVar26 != 0x30; lVar26 = lVar26 + 0x10) {
        *(undefined2 *)((long)&chip->adpcm[0].bank + lVar26) = 0x8000;
      }
      if (UVar3 != 0x61a) {
        UVar7 = 0x39;
        UVar13 = 0x55a;
        IVar2 = 0xe11;
        IVar20 = 0xdb2;
        IVar24 = 0x30;
        IVar21 = 0x2e;
      }
      else {
        chip->alt_filter[0].table_pos = 0xf73;
        chip->alt_filter[1].table_pos = 0xfa4;
        UVar7 = 0x4f;
        UVar13 = 0x542;
        IVar2 = 0xfa4;
        IVar20 = 0xf73;
        IVar21 = 0;
        IVar24 = 0;
      }
      chip->wet[0].delay = (ushort)(UVar3 == 0x61a);
      chip->dry[0].delay = IVar21;
      chip->wet[1].delay = 0;
      chip->wet[1].volume = 0x3fff;
      chip->dry[1].delay = IVar24;
      chip->filter[0].table_pos = IVar20;
      chip->filter[1].table_pos = IVar2;
      (chip->echo).end_pos = UVar13;
      chip->next_state = UVar7;
      chip->wet[0].volume = 0x3fff;
      chip->dry[0].volume = 0x3fff;
      chip->dry[1].volume = 0x3fff;
      chip->delay_update = 1;
      chip->ready_flag = '\0';
      chip->state_counter = 1;
      return;
    }
    chip->state_counter = 0;
    chip->state = chip->next_state;
  }
  return;
}

Assistant:

static void update_sample(struct qsound_chip *chip)
{
	switch(chip->state)
	{
		default:
		case STATE_INIT1:
		case STATE_INIT2:
			state_init(chip);
			return;
		case STATE_REFRESH1:
			state_refresh_filter_1(chip);
			return;
		case STATE_REFRESH2:
			state_refresh_filter_2(chip);
			return;
		case STATE_NORMAL1:
		case STATE_NORMAL2:
			state_normal_update(chip);
			return;
	}
}